

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_4ffb8::DebugExpr::parse_non_term(DebugExpr *this,Context *param_1)

{
  std::function<void_()>::operator()(&this->fn);
  return true;
}

Assistant:

virtual bool parse_non_term(Context &) const
	{
		fn();
		return true;
	}